

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-list.c
# Opt level: O0

monster_list_t * monster_list_new(void)

{
  wchar_t wVar1;
  monster_list_entry_t *pmVar2;
  size_t size;
  monster_list_t *list;
  
  list = (monster_list_t *)mem_zalloc(0x28);
  wVar1 = cave_monster_max(cave);
  if (list == (monster_list_t *)0x0) {
    list = (monster_list_t *)0x0;
  }
  else {
    pmVar2 = (monster_list_entry_t *)mem_zalloc((long)wVar1 << 5);
    list->entries = pmVar2;
    if (list->entries == (monster_list_entry_t *)0x0) {
      mem_free(list);
      list = (monster_list_t *)0x0;
    }
    else {
      list->entries_size = (long)wVar1;
    }
  }
  return list;
}

Assistant:

monster_list_t *monster_list_new(void)
{
	monster_list_t *list = mem_zalloc(sizeof(monster_list_t));
	size_t size = cave_monster_max(cave);

	if (list == NULL)
		return NULL;

	list->entries = mem_zalloc(size * sizeof(monster_list_entry_t));

	if (list->entries == NULL) {
		mem_free(list);
		return NULL;
	}

	list->entries_size = size;

	return list;
}